

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O1

void __thiscall
spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure
          (RegisterLiveness *this,Loop *loop,RegionRegisterLiveness *loop_reg_pressure)

{
  Op opcode;
  IRContext *this_00;
  mapped_type pBVar1;
  uint32_t uVar2;
  int32_t iVar3;
  RegionRegisterLiveness *pRVar4;
  size_type sVar5;
  mapped_type *ppBVar6;
  ulong uVar7;
  LiveSet *__range2;
  _Hash_node_base *p_Var8;
  Instruction *insn;
  __node_base _Var9;
  Instruction *pIVar10;
  __hashtable *__h;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b8;
  uint32_t local_ac;
  Loop *local_a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(loop_reg_pressure);
  pRVar4 = Get(this,loop->loop_header_);
  if (pRVar4 != loop_reg_pressure) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)loop_reg_pressure,
               (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)pRVar4);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a8 = loop;
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&local_68);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var9._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      pRVar4 = Get(this,*(uint32_t *)&_Var9._M_nxt[1]._M_nxt);
      local_a0._M_buckets = (__buckets_ptr)&loop_reg_pressure->live_out_;
      for (p_Var8 = (pRVar4->live_in_)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0
          ; p_Var8 = p_Var8->_M_nxt) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&loop_reg_pressure->live_out_,p_Var8 + 1,&local_a0);
      }
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
    } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var8 = (loop_reg_pressure->live_out_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      pIVar10 = (Instruction *)p_Var8[1]._M_nxt;
      RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar10);
      uVar2 = 0;
      if (pIVar10->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      local_b8 = &local_a0;
      local_ac = uVar2;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_a0,&local_ac,&local_b8);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  p_Var8 = (loop_reg_pressure->live_in_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      pIVar10 = (Instruction *)p_Var8[1]._M_nxt;
      uVar2 = 0;
      if (pIVar10->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      local_b8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)CONCAT44(local_b8._4_4_,uVar2);
      sVar5 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_a0,(key_type *)&local_b8);
      if (sVar5 != 0) {
        RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar10);
        uVar2 = 0;
        if (pIVar10->has_result_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
        }
        local_b8 = &local_a0;
        local_ac = uVar2;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a0,&local_ac,&local_b8);
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  loop_reg_pressure->used_registers_ = 0;
  p_Var8 = (local_a8->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  while( true ) {
    if (p_Var8 == (_Hash_node_base *)0x0) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    uVar2 = *(uint32_t *)&p_Var8[1]._M_nxt;
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    local_b8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)CONCAT44(local_b8._4_4_,uVar2);
    ppBVar6 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&((this_00->cfg_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                        .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->id2block_
                   ,(key_type *)&local_b8);
    pBVar1 = *ppBVar6;
    pRVar4 = Get(this,uVar2);
    if (pRVar4 == (RegionRegisterLiveness *)0x0) break;
    uVar7 = pRVar4->used_registers_;
    if (pRVar4->used_registers_ < loop_reg_pressure->used_registers_) {
      uVar7 = loop_reg_pressure->used_registers_;
    }
    loop_reg_pressure->used_registers_ = uVar7;
    for (pIVar10 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        pIVar10 != &(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        pIVar10 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      opcode = pIVar10->opcode_;
      if (((opcode != OpPhi) && (opcode != OpUndef)) && (pIVar10->has_result_id_ != false)) {
        iVar3 = spvOpcodeIsConstant(opcode);
        if ((iVar3 == 0) && (pIVar10->opcode_ != OpLabel)) {
          uVar2 = 0;
          if (pIVar10->has_result_id_ == true) {
            uVar2 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
          }
          local_b8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)CONCAT44(local_b8._4_4_,uVar2);
          sVar5 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&local_a0,(key_type *)&local_b8);
          if (sVar5 == 0) {
            RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,pIVar10);
          }
        }
      }
    }
    p_Var8 = p_Var8->_M_nxt;
  }
  __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x142,
                "void spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure(const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::ComputeLoopRegisterPressure(
    const Loop& loop, RegionRegisterLiveness* loop_reg_pressure) const {
  loop_reg_pressure->Clear();

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  loop_reg_pressure->live_in_ = header_live_inout->live_in_;

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    loop_reg_pressure->live_out_.insert(live_inout->live_in_.begin(),
                                        live_inout->live_in_.end());
  }

  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : loop_reg_pressure->live_out_) {
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : loop_reg_pressure->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  loop_reg_pressure->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    loop_reg_pressure->used_registers_ = std::max(
        loop_reg_pressure->used_registers_, live_inout->used_registers_);

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      loop_reg_pressure->AddRegisterClass(&insn);
    }
  }
}